

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O1

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  string end;
  string begin;
  RegularExpressionMatch match;
  long *local_120 [2];
  long local_110 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  RegularExpressionMatch local_c0;
  
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0')
     && (iVar4 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::originRegex), iVar4 != 0)) {
    ReplaceOrigin::originRegex.regmatch.startp[0] = (char *)0x0;
    ReplaceOrigin::originRegex.regmatch.endp[0] = (char *)0x0;
    ReplaceOrigin::originRegex.regmatch.searchstring = (char *)0x0;
    ReplaceOrigin::originRegex.program = (char *)0x0;
    cmsys::RegularExpression::compile(&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originRegex);
  }
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::originCurlyRegex), iVar4 != 0)) {
    ReplaceOrigin::originCurlyRegex.regmatch.startp[0] = (char *)0x0;
    ReplaceOrigin::originCurlyRegex.regmatch.endp[0] = (char *)0x0;
    ReplaceOrigin::originCurlyRegex.regmatch.searchstring = (char *)0x0;
    ReplaceOrigin::originCurlyRegex.program = (char *)0x0;
    cmsys::RegularExpression::compile(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originCurlyRegex);
  }
  local_c0.startp[0] = (char *)0x0;
  local_c0.endp[0] = (char *)0x0;
  local_c0.searchstring = (char *)0x0;
  bVar3 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,(rpath->_M_dataplus)._M_p,&local_c0);
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)rpath);
    std::__cxx11::string::substr((ulong)local_120,(ulong)rpath);
    std::operator+(&local_100,&local_e0,origin);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120[0]);
  }
  else {
    bVar3 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,(rpath->_M_dataplus)._M_p,&local_c0);
    if (!bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (rpath->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + rpath->_M_string_length);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)rpath);
    std::__cxx11::string::substr((ulong)local_120,(ulong)rpath);
    std::operator+(&local_100,&local_e0,origin);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120[0]);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start(1));
    std::string end = rpath.substr(match.end(1));
    return begin + origin + end;
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    std::string begin = rpath.substr(0, match.start());
    std::string end = rpath.substr(match.end());
    return begin + origin + end;
  }
  return rpath;
}